

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  XmlWriter *this_00;
  int iVar1;
  StringRef name;
  StringRef SVar2;
  size_type in_stack_ffffffffffffffb8;
  string local_40;
  
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::push_back
            (&(this->super_StreamingReporterBase).m_sectionStack,sectionInfo);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    this_00 = &this->m_xml;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Section",(allocator<char> *)&stack0xffffffffffffffbf);
    XmlWriter::startElement(this_00,&local_40,Newline|Indent);
    SVar2.m_size = in_stack_ffffffffffffffb8;
    SVar2.m_start = (char *)0x16351f;
    SVar2 = trim(SVar2);
    name.m_size = 4;
    name.m_start = "name";
    XmlWriter::writeAttribute(this_00,name,SVar2);
    std::__cxx11::string::~string((string *)&local_40);
    writeSourceInfo(this,&sectionInfo->lineInfo);
    XmlWriter::ensureTagClosed(this_00);
  }
  return;
}

Assistant:

void XmlReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        StreamingReporterBase::sectionStarting( sectionInfo );
        if( m_sectionDepth++ > 0 ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name"_sr, trim( StringRef(sectionInfo.name) ) );
            writeSourceInfo( sectionInfo.lineInfo );
            m_xml.ensureTagClosed();
        }
    }